

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

RepeatedField<unsigned_long> * __thiscall
google::protobuf::Reflection::GetRepeatedField<unsigned_long>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  RepeatedField<unsigned_long> *pRVar1;
  int in_R8D;
  
  pRVar1 = (RepeatedField<unsigned_long> *)
           MutableRawRepeatedField(this,message,field,CPPTYPE_UINT64,in_R8D,(Descriptor *)0x0);
  return pRVar1;
}

Assistant:

HANDLE_TYPE(float, FieldDescriptor::CPPTYPE_FLOAT, -1);
HANDLE_TYPE(double, FieldDescriptor::CPPTYPE_DOUBLE, -1);
HANDLE_TYPE(bool, FieldDescriptor::CPPTYPE_BOOL, -1);


#undef HANDLE_TYPE

void* Reflection::MutableRawRepeatedString(Message* message,
                                           const FieldDescriptor* field,
                                           bool is_string) const {
  return MutableRawRepeatedField(message, field,
                                 FieldDescriptor::CPPTYPE_STRING,
                                 FieldOptions::STRING, NULL);
}

// Template implementations of basic accessors.  Inline because each
// template instance is only called from one location.  These are
// used for all types except messages.
template <typename Type>
const Type& Reflection::GetField(const Message& message,
                                 const FieldDescriptor* field) const {
  return GetRaw<Type>(message, field);
}